

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * Strsafe(char *y)

{
  size_t sVar1;
  char *dest;
  char *in_RDI;
  char *cpy;
  char *z;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = Strsafe_find(in_stack_ffffffffffffffe8);
    if (local_8 == (char *)0x0) {
      sVar1 = strlen(in_RDI);
      dest = (char *)malloc((long)((int)sVar1 + 1));
      if (dest != (char *)0x0) {
        lemon_strcpy(dest,in_RDI);
        Strsafe_insert(y);
        local_8 = dest;
      }
    }
    if (local_8 == (char *)0x0) {
      memory_error();
    }
  }
  return local_8;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}